

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdFindVarNum(char *pDsd)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  byte bVar4;
  char *pcVar5;
  
  cVar3 = *pDsd;
  if (cVar3 != '\0') {
    pcVar5 = pDsd + 1;
    uVar1 = 0;
    do {
      bVar4 = cVar3 + 0x9f;
      uVar2 = (uint)bVar4;
      if (bVar4 < uVar1) {
        uVar2 = uVar1;
      }
      if (0x19 < bVar4) {
        uVar2 = uVar1;
      }
      uVar1 = uVar2;
      cVar3 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar3 != '\0');
    return uVar1 + 1;
  }
  return 1;
}

Assistant:

int Dau_DsdFindVarNum( char * pDsd )
{
    int vMax = 0;
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd <= 'z' )
            vMax = Abc_MaxInt( vMax, *pDsd - 'a' );
    return vMax + 1;
}